

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O2

void __thiscall r_exec::HLPBindingMap::init_from_f_ihlp(HLPBindingMap *this,_Fact *f_ihlp)

{
  byte bVar1;
  char cVar2;
  undefined1 uVar3;
  ushort uVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectValue *pOVar9;
  undefined4 extraout_var_01;
  AtomValue *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  StructureValue *pSVar10;
  long lVar11;
  ulong uVar12;
  Atom atom;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  AtomValue *local_40;
  Code *local_38;
  Code *pCVar8;
  
  local_38 = (Code *)f_ihlp;
  iVar6 = (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(f_ihlp,0);
  pCVar8 = (Code *)CONCAT44(extraout_var,iVar6);
  (*(pCVar8->super__Object)._vptr__Object[4])(pCVar8,2);
  uVar7 = r_code::Atom::asIndex();
  (*(pCVar8->super__Object)._vptr__Object[4])(pCVar8,(ulong)uVar7 & 0xffff);
  bVar1 = r_code::Atom::getAtomCount();
  local_48 = (ulong)bVar1 << 3;
  for (lVar11 = 0; uVar7 = uVar7 + 1, local_48 != lVar11; lVar11 = lVar11 + 8) {
    iVar6 = (*(pCVar8->super__Object)._vptr__Object[4])(pCVar8,(ulong)(uVar7 & 0xffff));
    _atom = *(undefined4 *)CONCAT44(extraout_var_00,iVar6);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x7c) {
      pOVar9 = (ObjectValue *)operator_new(0x20);
      uVar5 = r_code::Atom::asIndex();
      StructureValue::StructureValue((StructureValue *)pOVar9,&this->super_BindingMap,pCVar8,uVar5);
LAB_0016facf:
      core::P<r_exec::Value>::operator=
                ((P<r_exec::Value> *)
                 ((long)&((this->super_BindingMap).map.
                          super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->object + lVar11),
                 (Value *)pOVar9);
    }
    else {
      if (cVar2 == -0x7b) {
        pOVar9 = (ObjectValue *)operator_new(0x20);
        uVar4 = r_code::Atom::asIndex();
        iVar6 = (*(pCVar8->super__Object)._vptr__Object[9])(pCVar8,(ulong)uVar4);
        ObjectValue::ObjectValue
                  (pOVar9,&this->super_BindingMap,(Code *)CONCAT44(extraout_var_01,iVar6));
        goto LAB_0016facf;
      }
      this_00 = (AtomValue *)operator_new(0x20);
      local_4c = _atom;
      AtomValue::AtomValue(this_00,&this->super_BindingMap,(Atom *)&local_4c);
      core::P<r_exec::Value>::operator=
                ((P<r_exec::Value> *)
                 ((long)&((this->super_BindingMap).map.
                          super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->object + lVar11),
                 (Value *)this_00);
      r_code::Atom::~Atom((Atom *)&local_4c);
    }
    r_code::Atom::~Atom(&atom);
  }
  (*(pCVar8->super__Object)._vptr__Object[4])(pCVar8,3);
  iVar6 = r_code::Atom::asIndex();
  uVar4 = (this->super_BindingMap).first_index;
  uVar12 = (ulong)uVar4;
  lVar11 = (ulong)uVar4 << 3;
  local_48 = CONCAT44(local_48._4_4_,iVar6 + 1) & 0xffffffff0000ffff;
  do {
    if ((ulong)((long)(this->super_BindingMap).map.
                      super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_BindingMap).map.
                      super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar12) {
      pSVar10 = (StructureValue *)operator_new(0x20);
      pCVar8 = local_38;
      StructureValue::StructureValue(pSVar10,&this->super_BindingMap,local_38,2);
      core::P<r_exec::Value>::operator=
                ((this->super_BindingMap).map.
                 super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (this->super_BindingMap).fwd_after_index,(Value *)pSVar10);
      pSVar10 = (StructureValue *)operator_new(0x20);
      StructureValue::StructureValue(pSVar10,&this->super_BindingMap,pCVar8,3);
      core::P<r_exec::Value>::operator=
                ((this->super_BindingMap).map.
                 super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (this->super_BindingMap).fwd_before_index,(Value *)pSVar10);
      return;
    }
    uVar4 = (this->super_BindingMap).fwd_after_index;
    if ((0 < (short)uVar4 && uVar12 == uVar4) ||
       (uVar4 = (this->super_BindingMap).fwd_before_index, 0 < (short)uVar4 && uVar12 == uVar4))
    goto LAB_0016fc91;
    iVar6 = (*(pCVar8->super__Object)._vptr__Object[4])(pCVar8,local_48 & 0xffffffff);
    _atom = *(undefined4 *)CONCAT44(extraout_var_02,iVar6);
    uVar3 = r_code::Atom::getDescriptor();
    switch(uVar3) {
    case 0x82:
    case 0x83:
    case 0x86:
      break;
    case 0x84:
      pOVar9 = (ObjectValue *)operator_new(0x20);
      uVar5 = r_code::Atom::asIndex();
      StructureValue::StructureValue((StructureValue *)pOVar9,&this->super_BindingMap,pCVar8,uVar5);
      goto LAB_0016fc37;
    case 0x85:
      pOVar9 = (ObjectValue *)operator_new(0x20);
      uVar4 = r_code::Atom::asIndex();
      iVar6 = (*(pCVar8->super__Object)._vptr__Object[9])(pCVar8,(ulong)uVar4);
      ObjectValue::ObjectValue
                (pOVar9,&this->super_BindingMap,(Code *)CONCAT44(extraout_var_03,iVar6));
LAB_0016fc37:
      core::P<r_exec::Value>::operator=
                ((P<r_exec::Value> *)
                 ((long)&((this->super_BindingMap).map.
                          super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->object + lVar11),
                 (Value *)pOVar9);
      break;
    default:
      local_40 = (AtomValue *)operator_new(0x20);
      local_50 = _atom;
      AtomValue::AtomValue(local_40,&this->super_BindingMap,(Atom *)&local_50);
      core::P<r_exec::Value>::operator=
                ((P<r_exec::Value> *)
                 ((long)&((this->super_BindingMap).map.
                          super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->object + lVar11),
                 (Value *)local_40);
      r_code::Atom::~Atom((Atom *)&local_50);
    }
    r_code::Atom::~Atom(&atom);
LAB_0016fc91:
    uVar12 = uVar12 + 1;
    lVar11 = lVar11 + 8;
  } while( true );
}

Assistant:

void HLPBindingMap::init_from_f_ihlp(const _Fact *f_ihlp)   // source is f->icst or f->imdl; map already initialized with values from hlp.
{
    Code *ihlp = f_ihlp->get_reference(0);
    uint16_t tpl_val_set_index = ihlp->code(I_HLP_TPL_ARGS).asIndex();
    uint16_t tpl_val_count = ihlp->code(tpl_val_set_index++).getAtomCount();

    for (uint16_t i = 0; i < tpl_val_count; ++i) { // valuate tpl args.
        Atom atom = ihlp->code(tpl_val_set_index + i);

        switch (atom.getDescriptor()) {
        case Atom::R_PTR:
            map[i] = new ObjectValue(this, ihlp->get_reference(atom.asIndex()));
            break;

        case Atom::I_PTR:
            map[i] = new StructureValue(this, ihlp, atom.asIndex());
            break;

        default:
            map[i] = new AtomValue(this, atom);
            break;
        }
    }

    uint16_t val_set_index = ihlp->code(I_HLP_ARGS).asIndex() + 1;
    uint64_t i = 0;

    for (uint64_t j = first_index; j < map.size(); ++j) { // valuate args.
        if ((fwd_after_index > 0 && j == uint64_t(fwd_after_index)) || (fwd_before_index > 0 && j == uint64_t(fwd_before_index))) {
            continue;
        }

        Atom atom = ihlp->code(val_set_index + i);

        switch (atom.getDescriptor()) {
        case Atom::R_PTR:
            map[j] = new ObjectValue(this, ihlp->get_reference(atom.asIndex()));
            break;

        case Atom::I_PTR:
            map[j] = new StructureValue(this, ihlp, atom.asIndex());
            break;

        case Atom::WILDCARD:
        case Atom::T_WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            map[j] = new AtomValue(this, atom);
            break;
        }
    }

    map[fwd_after_index] = new StructureValue(this, f_ihlp, FACT_AFTER); // valuate timings; fwd_after_index is already known.
    map[fwd_before_index] = new StructureValue(this, f_ihlp, FACT_BEFORE);
}